

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

Datatype * __thiscall
TypeOpIntRight::getInputCast(TypeOpIntRight *this,PcodeOp *op,int4 slot,CastStrategy *castStrategy)

{
  int iVar1;
  Datatype *pDVar2;
  undefined4 extraout_var;
  HighVariable *this_00;
  undefined4 extraout_var_00;
  
  if (slot != 0) {
    pDVar2 = TypeOp::getInputCast((TypeOp *)this,op,slot,castStrategy);
    return pDVar2;
  }
  iVar1 = (*op->opcode->_vptr_TypeOp[6])(op->opcode,op,0);
  this_00 = Varnode::getHigh(*(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  pDVar2 = HighVariable::getType(this_00);
  iVar1 = (*castStrategy->_vptr_CastStrategy[6])
                    (castStrategy,CONCAT44(extraout_var,iVar1),pDVar2,1,1,
                     castStrategy->_vptr_CastStrategy[6]);
  return (Datatype *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

Datatype *TypeOpIntRight::getInputCast(const PcodeOp *op,int4 slot,const CastStrategy *castStrategy) const

{
  if (slot == 0) {
    Datatype *reqtype = op->inputTypeLocal(slot);
    Datatype *curtype = op->getIn(slot)->getHigh()->getType();
    return castStrategy->castStandard(reqtype,curtype,true,true);
  }
  return TypeOpBinary::getInputCast(op,slot,castStrategy);
}